

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

Var Js::JavascriptProxy::FunctionCallTrap(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  PropertyId methodId;
  code *pcVar3;
  int iVar4;
  RecyclableObject *pRVar5;
  SparseArraySegmentBase *aValue;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  BOOL BVar9;
  uint uVar10;
  undefined4 *puVar11;
  JavascriptArray *pJVar12;
  JavascriptFunction *this;
  Var pvVar13;
  JavascriptArray *pJVar14;
  Type TVar15;
  FunctionInfo *pFVar16;
  JavascriptMethod entryPoint;
  PCWSTR varName;
  uint uVar17;
  long lVar18;
  Arguments *pAVar19;
  uint uVar20;
  Type TVar21;
  ushort uVar22;
  ulong uVar23;
  uint uVar24;
  int in_stack_00000010;
  Arguments local_108;
  Arguments local_f8;
  Arguments local_e8;
  RecyclableObject *pRStack_d8;
  Var stackArgs [8];
  Var local_80;
  RecyclableObject **local_78;
  CallInfo local_50;
  CallInfo callInfo_local;
  undefined1 local_40 [8];
  ArgumentReader args;
  
  pAVar19 = &local_108;
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x837,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) goto LAB_00ba37bd;
    *puVar11 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)local_40,&local_50,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  uVar24 = (uint)local_40[3];
  local_108.Values = (Type)args.super_Arguments.Info;
  bVar7 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_108);
  bVar6 = local_40[3];
  if (CONCAT12(local_40[2],local_40._0_2_) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x83e,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar8) goto LAB_00ba37bd;
    *puVar11 = 0;
  }
  bVar8 = VarIsImpl<Js::JavascriptProxy>(function);
  if (bVar8) {
    pJVar12 = (JavascriptArray *)VarTo<Js::JavascriptProxy,Js::RecyclableObject>(function);
    pRVar5 = ((Type *)&(pJVar12->super_ArrayObject).length)->ptr;
    aValue = (pJVar12->head).ptr;
    bVar8 = ScriptContext::IsHeapEnumInProgress(pSVar1);
    if (bVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x851,"(!scriptContext->IsHeapEnumInProgress())",
                                  "!scriptContext->IsHeapEnumInProgress()");
      if (!bVar8) goto LAB_00ba37bd;
      *puVar11 = 0;
    }
    callInfo_local._0_4_ = uVar24 << 0x18 & 0x40000000;
    callInfo_local._4_4_ = 0;
    pJVar14 = pJVar12;
    if ((uVar24 << 0x18 & 0x40000000) != 0) {
      pJVar14 = *(JavascriptArray **)
                 ((long)args.super_Arguments.Info + (ulong)(local_50._0_4_ & 0xffffff) * 8);
    }
    methodId = 0x66;
    if ((local_40[3] & 1) == 0) {
      methodId = 0x4e;
    }
    this = GetMethodHelper((JavascriptProxy *)pJVar12,methodId,pSVar1);
    bVar8 = JavascriptConversion::IsCallable((RecyclableObject *)aValue);
    if (bVar8) {
      if (this == (JavascriptFunction *)0x0) {
        if (0xfffe < CONCAT12(local_40[2],local_40._0_2_)) {
          JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec52,(PCWSTR)0x0);
        }
        if ((local_40[3] & 1) == 0) {
          local_80 = (Var)0x0;
        }
        else {
          bVar8 = JavascriptOperators::IsConstructor((RecyclableObject *)aValue);
          if (!bVar8) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec40,L"construct");
          }
          if ((!bVar7) || (local_80 = *(Var *)args.super_Arguments.Info, local_80 == (Var)0x0)) {
            pTVar2 = pSVar1->threadContext;
            bVar7 = pTVar2->reentrancySafeOrHandled;
            pTVar2->reentrancySafeOrHandled = true;
            local_80 = JavascriptOperators::NewScObjectNoCtorCommon(pJVar12,pSVar1,false);
            pTVar2->reentrancySafeOrHandled = bVar7;
            *(Var *)args.super_Arguments.Info = local_80;
          }
        }
        lVar18 = (ulong)((bVar6 & 1) << 0x18) + (long)callInfo_local;
        uVar23 = (ulong)CONCAT13(local_40[3],CONCAT12(local_40[2],local_40._0_2_));
        if ((lVar18 != 0) &&
           (uVar23 = (ulong)(ushort)(local_40._0_2_ + 1), (ushort)(local_40._0_2_ + 1) == 0)) {
          ::Math::DefaultOverflowPolicy();
        }
        uVar22 = (ushort)uVar23;
        callInfo_local = (CallInfo)(uVar23 & 0xffff);
        if (callInfo_local._0_4_ < (CONCAT12(local_40[2],local_40._0_2_) & 0xffff)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                      ,0x895,"(newCount >= (ushort)args.Info.Count)",
                                      "newCount >= (ushort)args.Info.Count");
          if (!bVar7) goto LAB_00ba37bd;
          *puVar11 = 0;
        }
        if (uVar22 < 9) {
          local_78 = &pRStack_d8;
        }
        else {
          iVar4 = callInfo_local._0_4_;
          ThreadContext::ProbeStack
                    (pSVar1->threadContext,(ulong)(uint)(iVar4 * 8) + 0xc00,pSVar1,(PVOID)0x0);
          pAVar19 = (Arguments *)((long)&local_108 - (ulong)(iVar4 * 8 + 0xfU & 0xfffffff0));
          local_78 = (RecyclableObject **)pAVar19;
        }
        TVar21._2_1_ = local_40[2];
        TVar21._0_2_ = local_40._0_2_;
        TVar21._3_1_ = local_40[3];
        TVar21._4_4_ = 0;
        TVar15 = (Type)((ulong)TVar21 | 0x48000000);
        if (lVar18 == 0) {
          TVar15 = TVar21;
        }
        *(undefined8 *)((long)pAVar19 + -8) = 0xba356d;
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        uVar24 = 0;
        while( true ) {
          uVar20 = TVar21._0_4_;
          uVar17 = uVar24 & 0xffff;
          uVar10 = uVar20 & 0xffff;
          if (uVar10 <= uVar17) break;
          if ((uint)callInfo_local._0_4_ < uVar10) {
            AssertCount = AssertCount + 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba3598;
            Throw::LogAssert();
            *puVar11 = 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba35bf;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0x8ac,"(newCount >= ((ushort)args.Info.Count))",
                                        "newCount >= ((ushort)args.Info.Count)");
            if (!bVar7) goto LAB_00ba37bd;
            *puVar11 = 0;
          }
          if (uVar22 <= (ushort)uVar24) {
            AssertCount = AssertCount + 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba35db;
            Throw::LogAssert();
            *puVar11 = 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba3602;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0x8ad,"(argCount < newCount)","argCount < newCount");
            if (!bVar7) goto LAB_00ba37bd;
            *puVar11 = 0;
          }
          if ((ushort)local_40._0_2_ <= uVar17) {
            AssertCount = AssertCount + 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba3620;
            Throw::LogAssert();
            *puVar11 = 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba3647;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0x8ae,"(argCount < (ushort)args.Info.Count)",
                                        "argCount < (ushort)args.Info.Count");
            if (!bVar7) goto LAB_00ba37bd;
            *puVar11 = 0;
          }
          if (uVar22 <= (ushort)uVar24) {
            AssertCount = AssertCount + 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba3663;
            Throw::LogAssert();
            *puVar11 = 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba368a;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0x8b0,
                                        "(sizeof(Var*) * argCount < sizeof(void*) * newCount)",
                                        "sizeof(Var*) * argCount < sizeof(void*) * newCount");
            if (!bVar7) goto LAB_00ba37bd;
            *puVar11 = 0;
          }
          *(undefined8 *)((long)local_78 + (ulong)(uVar17 << 3)) =
               *(undefined8 *)((long)args.super_Arguments.Info + (ulong)(uVar17 << 3));
          uVar24 = uVar17 + 1;
          TVar21._2_1_ = local_40[2];
          TVar21._0_2_ = local_40._0_2_;
          TVar21._3_5_ = 0;
        }
        if (lVar18 != 0) {
          if (uVar10 + 1 != callInfo_local._0_4_) {
            AssertCount = AssertCount + 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba36dd;
            Throw::LogAssert();
            *puVar11 = 1;
            *(undefined8 *)((long)pAVar19 + -8) = 0xba3704;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0x8b6,"(newCount == ((ushort)args.Info.Count) + 1)",
                                        "newCount == ((ushort)args.Info.Count) + 1");
            if (!bVar7) {
LAB_00ba37bd:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar11 = 0;
            uVar20 = (uint)CONCAT12(local_40[2],local_40._0_2_);
          }
          local_78[uVar20 & 0xffffff] = (RecyclableObject *)pJVar14;
          *(undefined8 *)((long)pAVar19 + -8) = 0xba3731;
          pFVar16 = JavascriptOperators::GetConstructorFunctionInfo(aValue,pSVar1);
          if ((pFVar16 != (FunctionInfo *)0x0) && ((pFVar16->attributes & ClassConstructor) != None)
             ) {
            *local_78 = (RecyclableObject *)pJVar14;
          }
        }
        pTVar2 = pSVar1->threadContext;
        bVar7 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        *(undefined8 *)((long)pAVar19 + -8) = 0xba3769;
        entryPoint = RecyclableObject::GetEntryPoint((RecyclableObject *)aValue);
        local_f8.Values = local_78;
        local_f8.Info = TVar15;
        *(undefined8 *)((long)pAVar19 + -8) = 0xba378c;
        pvVar13 = JavascriptFunction::CallFunction<true>
                            ((RecyclableObject *)aValue,entryPoint,&local_f8,false);
        pTVar2->reentrancySafeOrHandled = bVar7;
        if (((ulong)local_50 & 0x1000000) != 0) {
          *(undefined8 *)((long)pAVar19 + -8) = 0xba37a4;
          BVar9 = JavascriptOperators::IsObject(pvVar13);
          if (BVar9 == 0) {
            pvVar13 = local_80;
          }
        }
      }
      else {
        pJVar12 = JavascriptLibrary::CreateArray
                            ((pSVar1->super_ScriptContextBase).javascriptLibrary,
                             (local_50._0_4_ & 0xffffff) - 1);
        for (uVar24 = 1; uVar24 < (local_50._0_4_ & 0xffffff); uVar24 = uVar24 + 1) {
          pvVar13 = Arguments::operator[]((Arguments *)local_40,uVar24);
          JavascriptArray::DirectSetItemAt<void*>(pJVar12,uVar24 - 1,pvVar13);
        }
        pRStack_d8 = pRVar5;
        stackArgs[0] = aValue;
        if ((local_40[3] & 1) == 0) {
          stackArgs[1] = Arguments::operator[]((Arguments *)local_40,0);
          pJVar14 = pJVar12;
        }
        else {
          bVar8 = JavascriptOperators::IsConstructor((RecyclableObject *)aValue);
          if (!bVar8) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec00,(PCWSTR)0x0);
          }
          stackArgs[1] = pJVar12;
          if (bVar7 && callInfo_local == (CallInfo)0x0) {
            pJVar14 = (JavascriptArray *)Arguments::operator[]((Arguments *)local_40,0);
          }
        }
        local_e8.Values = &pRStack_d8;
        pTVar2 = pSVar1->threadContext;
        bVar7 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        local_e8.Info = (Type)0x2000004;
        stackArgs[2] = pJVar14;
        pvVar13 = JavascriptFunction::CallFunction(this,&local_e8);
        pTVar2->reentrancySafeOrHandled = bVar7;
        if ((local_40[3] & 1) != 0) {
          BVar9 = JavascriptOperators::IsObject(pvVar13);
          if (BVar9 == 0) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea14,L"construct");
          }
        }
      }
      return pvVar13;
    }
  }
  else if ((local_40[3] & 1) != 0) {
    varName = L"construct";
    goto LAB_00ba37d5;
  }
  varName = L"call";
LAB_00ba37d5:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,varName);
}

Assistant:

Var JavascriptProxy::FunctionCallTrap(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        BOOL hasOverridingNewTarget = args.HasNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
        bool isNewCall = args.IsNewCall() || hasOverridingNewTarget;

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (!VarIs<JavascriptProxy>(function))
        {
            if (args.Info.Flags & CallFlags_New)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("construct"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("call"));
            }
        }

        Var newTarget = nullptr;
        JavascriptProxy* proxy = VarTo<JavascriptProxy>(function);
        Js::RecyclableObject *handlerObj = proxy->handler;
        Js::RecyclableObject *targetObj = proxy->target;

        JavascriptFunction* callMethod;
        Assert(!scriptContext->IsHeapEnumInProgress());

        // To conform with ES6 spec 7.3.13
        if (hasOverridingNewTarget)
        {
            newTarget = args.Values[callInfo.Count];
        }
        else
        {
            newTarget = proxy;
        }

        if (args.Info.Flags & CallFlags_New)
        {
            callMethod = proxy->GetMethodHelper(PropertyIds::construct, scriptContext);
        }
        else
        {
            callMethod = proxy->GetMethodHelper(PropertyIds::apply, scriptContext);
        }
        if (!JavascriptConversion::IsCallable(targetObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("call"));
        }

        if (nullptr == callMethod)
        {
            // newCount is ushort. If args count is greater than or equal to 65535, an integer
            // too many arguments
            if (args.Info.Count >= USHORT_MAX) //check against CallInfo::kMaxCountArgs if newCount is ever made int
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgListTooLarge);
            }

            // in [[construct]] case, we don't need to check if the function is a constructor: the function should throw there.
            Var newThisObject = nullptr;
            if (args.Info.Flags & CallFlags_New)
            {
                if (!JavascriptOperators::IsConstructor(targetObj))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("construct"));
                }

                // args.Values[0] will be null in the case where NewTarget is initially provided by proxy.
                if (!isCtorSuperCall || !args.Values[0])
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        newThisObject = JavascriptOperators::NewScObjectNoCtorCommon(proxy, scriptContext, false);
                    }
                    END_SAFE_REENTRANT_CALL
                    args.Values[0] = newThisObject;
                }
                else
                {
                    newThisObject = args.Values[0];
                }
            }

            ushort newCount = (ushort)args.Info.Count;
            if (isNewCall)
            {
                newCount++;
                if (!newCount)
                {
                    ::Math::DefaultOverflowPolicy();
                }
            }
            AnalysisAssert(newCount >= (ushort)args.Info.Count);

            Var* newValues;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            if (newCount > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, newCount * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                newValues = (Var*)_alloca(newCount * sizeof(Var));
            }
            else
            {
                newValues = stackArgs;
            }

            CallInfo calleeInfo((CallFlags)(args.Info.Flags), args.Info.Count);
            if (isNewCall)
            {
                calleeInfo.Flags = (CallFlags)(calleeInfo.Flags | CallFlags_ExtraArg | CallFlags_NewTarget);
            }

            for (ushort argCount = 0; argCount < (ushort)args.Info.Count; argCount++)
            {
                AnalysisAssert(newCount >= ((ushort)args.Info.Count));
                AnalysisAssert(argCount < newCount);
                AnalysisAssert(argCount < (ushort)args.Info.Count);
                AnalysisAssert(sizeof(Var*) == sizeof(void*));
                AnalysisAssert(sizeof(Var*) * argCount < sizeof(void*) * newCount);
#pragma prefast(suppress:__WARNING_WRITE_OVERRUN, "This is a false positive, and all of the above analysis asserts still didn't convince prefast of that.")
                newValues[argCount] = args.Values[argCount];
            }
            if (isNewCall)
            {
                AnalysisAssert(newCount == ((ushort)args.Info.Count) + 1);
                newValues[args.Info.Count] = newTarget;

                // If the function we're calling is a class constructor, it expects newTarget
                // as the first arg so it knows how to construct "this". (We can leave the
                // extra copy of newTarget at the end of the arguments; it's harmless so
                // there's no need to introduce additional complexity here.)
                FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(targetObj, scriptContext);
                if (functionInfo && functionInfo->IsClassConstructor())
                {
                    newValues[0] = newTarget;
                }
            }

            Js::Arguments arguments(calleeInfo, newValues);
            Var aReturnValue = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                aReturnValue = JavascriptFunction::CallFunction<true>(targetObj, targetObj->GetEntryPoint(), arguments);
            }
            END_SAFE_REENTRANT_CALL
            // If this is constructor call, return the actual object instead of function result
            if ((callInfo.Flags & CallFlags_New) && !JavascriptOperators::IsObject(aReturnValue))
            {
                aReturnValue = newThisObject;
            }
            return aReturnValue;
        }

        JavascriptArray* argList = scriptContext->GetLibrary()->CreateArray(callInfo.Count - 1);
        for (uint i = 1; i < callInfo.Count; i++)
        {
            argList->DirectSetItemAt(i - 1, args[i]);
        }

        Var varArgs[4];
        CallInfo calleeInfo(CallFlags_Value, 4);
        Js::Arguments arguments(calleeInfo, varArgs);

        varArgs[0] = handlerObj;
        varArgs[1] = targetObj;
        if (args.Info.Flags & CallFlags_New)
        {
            if (!JavascriptOperators::IsConstructor(targetObj))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor);
            }

            varArgs[2] = argList;
            // 1st preference - overridden newTarget
            // 2nd preference - 'this' in case of super() call
            // 3rd preference - newTarget ( which is same as F)
            varArgs[3] = hasOverridingNewTarget ? newTarget :
                isCtorSuperCall ? args[0] : newTarget;
         }
        else
        {
            varArgs[2] = args[0];
            varArgs[3] = argList;
        }

        Var trapResult = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            trapResult = callMethod->CallFunction(arguments);
        }
        END_SAFE_REENTRANT_CALL
        if (args.Info.Flags & CallFlags_New)
        {
            if (!Js::JavascriptOperators::IsObject(trapResult))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InconsistentTrapResult, _u("construct"));
            }
        }
        return trapResult;
    }